

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O0

_Bool test_copy(void)

{
  int n_row;
  int n_col;
  long lVar1;
  uint8_t *memory;
  byte bVar2;
  int *memory_00;
  int aiStack_d0 [2];
  undefined4 uStack_c8;
  int iStack_c4;
  undefined8 uStack_c0;
  uint8_t *local_b8;
  int local_ac;
  int local_a8;
  int local_a4;
  int c;
  int r;
  m256v B;
  unsigned_long __vla_expr1;
  m256v A;
  unsigned_long __vla_expr0;
  uint local_54;
  int nc;
  int ic;
  int nr;
  int ir;
  int ncol [6];
  int local_28 [2];
  int nrow [6];
  
  nrow[0] = 3;
  nrow[1] = 5;
  nrow[2] = 9;
  nrow[3] = 10;
  _nr = 0x200000001;
  ncol[0] = 3;
  ncol[1] = 7;
  ncol[2] = 8;
  ncol[3] = 10;
  for (ic = 0; (uint)ic < 6; ic = ic + 1) {
    n_row = nrow[(long)ic + -2];
    for (local_54 = 0; local_54 < 6; local_54 = local_54 + 1) {
      n_col = (&nr)[(int)local_54];
      lVar1 = -((ulong)((uint8_t *)(ulong)(uint)(n_row * n_col) + 0xf) & 0xfffffffffffffff0);
      local_b8 = (uint8_t *)((long)&uStack_c8 + lVar1);
      A.e = (uint8_t *)(ulong)(uint)(n_row * n_col);
      *(undefined8 *)((long)aiStack_d0 + lVar1) = 0x102118;
      rand_coeffs(*(uint8_t **)((long)&uStack_c0 + lVar1),*(int *)((long)&iStack_c4 + lVar1),
                  *(uint8_t *)((long)&uStack_c8 + lVar1 + 3));
      memory = local_b8;
      *(undefined8 *)((long)aiStack_d0 + lVar1) = 0x10212e;
      m256v_make((m256v *)&__vla_expr1,n_row,n_col,memory);
      B.e = (uint8_t *)(ulong)(uint)(n_row * n_col);
      memory_00 = (int *)((uint8_t *)((long)&uStack_c8 + lVar1) +
                         -((ulong)(B.e + 0xf) & 0xfffffffffffffff0));
      memory_00[-2] = 0x102161;
      memory_00[-1] = 0;
      m256v_make((m256v *)&c,n_row,n_col,(uint8_t *)memory_00);
      memory_00[-2] = 0x102171;
      memory_00[-1] = 0;
      m256v_copy(*(m256v **)(memory_00 + 2),*(m256v **)memory_00);
      for (local_a4 = 0; local_a4 < n_row; local_a4 = local_a4 + 1) {
        for (local_a8 = 0; local_a8 < n_col; local_a8 = local_a8 + 1) {
          memory_00[-2] = 0x1021b4;
          memory_00[-1] = 0;
          bVar2 = m256v_get_el(*(m256v **)(memory_00 + 2),memory_00[1],*memory_00);
          uStack_c0._4_4_ = (uint)bVar2;
          memory_00[-2] = 0x1021d5;
          memory_00[-1] = 0;
          bVar2 = m256v_get_el(*(m256v **)(memory_00 + 2),memory_00[1],*memory_00);
          if (uStack_c0._4_4_ != bVar2) {
            nrow[5]._3_1_ = 0;
            local_ac = 1;
            goto LAB_00102227;
          }
        }
      }
      local_ac = 0;
LAB_00102227:
      if (local_ac != 0) goto LAB_00102260;
    }
  }
  nrow[5]._3_1_ = 1;
LAB_00102260:
  return (_Bool)(nrow[5]._3_1_ & 1);
}

Assistant:

static bool test_copy()
{
	const int nrow[] = { 1, 2, 3, 5, 9, 10 };
	const int ncol[] = { 1, 2, 3, 7, 8, 10 };
	for (int ir = 0; ir < array_size(nrow); ++ir) {
		const int nr = nrow[ir];
		for (int ic = 0; ic < array_size(ncol); ++ic) {
			const int nc = ncol[ic];

			Def_mat256_rand(A, a, nr, nc, 0xff)
			m256v_Def(B, b, nr, nc);
			m256v_copy(&A, &B);

			for (int r = 0; r < nr; ++r) {
				for (int c = 0; c < nc; ++c) {
					if (m256v_get_el(&A, r, c)
					   != m256v_get_el(&B, r, c))
					{
						return false;
					}
				}
			}
		}
	}

	return true;
}